

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR COM_getfileinfo(LispPTR *args)

{
  int iVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  char *pcVar4;
  DLword *pDVar5;
  int *piVar6;
  passwd *ppVar7;
  size_t x;
  bool bVar8;
  LispPTR local_3394;
  int local_3390;
  ulong local_3388;
  size_t lf_i_2;
  char *lf_dptr_2;
  char *lf_sptr_2;
  LispPTR *lf_naddress_1;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  LispPTR *lf_naddress;
  char *lf_cp;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  undefined1 local_32e8 [4];
  LispPTR laddr;
  stat sbuf;
  char ver [16];
  char name [255];
  char dir [4096];
  char host [255];
  char file [4096];
  char lfname [4101];
  char *base;
  passwd *pwd;
  uint *bufp;
  size_t len;
  int rval;
  int dskp;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    pLVar3 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar3 + 6) == 'C') {
      len._0_4_ = pLVar3[2];
      len._4_4_ = 0;
    }
    else if (*(char *)((long)pLVar3 + 6) == 'D') {
      len._0_4_ = pLVar3[2] << 1;
      len._4_4_ = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (len._4_4_ == 0) {
      local_3390 = (LispPTR)len + 3;
    }
    else {
      local_3390 = (LispPTR)len + 5;
    }
    if (local_3390 < 0x1006) {
      pLVar3 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar3[2] < 0x1000) {
        local_3394 = pLVar3[2];
      }
      else {
        local_3394 = 0x1000;
      }
      pcVar4 = (char *)(long)(int)local_3394;
      if (*(char *)((long)pLVar3 + 6) == 'C') {
        pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
        lf_i = (size_t)(file + 0xff8);
        lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar3[1]);
        for (lf_ii = 0; lf_ii < pcVar4; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (file + 0xff8)[(long)pcVar4] = '\0';
      }
      else if (*(char *)((long)pLVar3 + 6) == 'D') {
        pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
        lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar3[1]);
        lf_sbase = (short *)(file + 0xff8);
        for (lf_cp = (char *)0x0; lf_cp < pcVar4; lf_cp = lf_cp + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      separate_host(file + 0xff8,dir + 0xff8);
      for (lf_naddress = (LispPTR *)(dir + 0xff8); (char)*lf_naddress != '\0';
          lf_naddress = (LispPTR *)((long)lf_naddress + 1)) {
        if (('`' < (char)*lf_naddress) && ((char)*lf_naddress < '{')) {
          *(char *)lf_naddress = (char)*lf_naddress + -0x20;
        }
      }
      iVar1 = strcmp(dir + 0xff8,"DSK");
      if (iVar1 == 0) {
        len._4_4_ = 1;
      }
      else {
        iVar1 = strcmp(dir + 0xff8,"UNIX");
        if (iVar1 != 0) {
          return 0;
        }
        len._4_4_ = 0;
      }
      unixpathname(file + 0xff8,host + 0xf8,len._4_4_,0);
      if (len._4_4_ != 0) {
        iVar1 = unpack_filename(host + 0xf8,name + 0xf8,ver + 8,(char *)(sbuf.__glibc_reserved + 2),
                                1);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = true_name(name + 0xf8);
        if (iVar1 != -1) {
          return 0;
        }
        iVar1 = strcmp(ver + 8,"");
        if (iVar1 == 0) {
          strcpy(host + 0xf8,name + 0xf8);
        }
        else {
          iVar1 = get_version_array(name + 0xf8,ver + 8);
          if (iVar1 == 0) {
            return 0;
          }
          if ((char)sbuf.__glibc_reserved[2] == '\0') {
            strcpy(host + 0xf8,ver + 8);
          }
          else {
            strcpy(host + 0xf8,ver + 8);
            strcat(host + 0xf8,".~");
            strcat(host + 0xf8,(char *)(sbuf.__glibc_reserved + 2));
            strcat(host + 0xf8,"~");
          }
          iVar1 = get_old(name + 0xf8,VA.files,host + 0xf8,ver + 8);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
      alarm(TIMEOUT_TIME);
      do {
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar1 = stat(host + 0xf8,(stat *)local_32e8);
        bVar8 = false;
        if (iVar1 == -1) {
          piVar6 = __errno_location();
          bVar8 = *piVar6 == 4;
        }
      } while (bVar8);
      alarm(0);
      if (iVar1 == 0) {
        switch(args[1]) {
        case 0xe0001:
          pLVar3 = NativeAligned4FromLAddr(args[2]);
          *pLVar3 = (LispPTR)sbuf.st_rdev;
          args_local._4_4_ = 0x4c;
          break;
        case 0xe0002:
          pLVar3 = NativeAligned4FromLAddr(args[2]);
          *pLVar3 = (int)sbuf.st_atim.tv_nsec + 0x1c94b00;
          args_local._4_4_ = 0x4c;
          break;
        case 0xe0003:
          pLVar3 = NativeAligned4FromLAddr(args[2]);
          *pLVar3 = (int)sbuf.st_blocks + 0x1c94b00;
          args_local._4_4_ = 0x4c;
          break;
        default:
          args_local._4_4_ = 0;
          break;
        case 0xe0005:
          alarm(TIMEOUT_TIME);
          do {
            piVar6 = __errno_location();
            *piVar6 = 0;
            ppVar7 = getpwuid(sbuf.st_nlink._4_4_);
            bVar8 = false;
            if (ppVar7 == (passwd *)0x0) {
              piVar6 = __errno_location();
              bVar8 = *piVar6 == 4;
            }
          } while (bVar8);
          alarm(0);
          if (ppVar7 == (passwd *)0x0) {
            args_local._4_4_ = 0xe0000;
          }
          else {
            pLVar3 = NativeAligned4FromLAddr(args[2]);
            lf_i_1 = (size_t)NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
            pLVar3 = (LispPTR *)strlen(ppVar7->pw_name);
            lf_dptr_1 = ppVar7->pw_name;
            for (lf_naddress_1 = (LispPTR *)0x0; lf_naddress_1 < pLVar3;
                lf_naddress_1 = (LispPTR *)((long)lf_naddress_1 + 1)) {
              *(char *)(lf_i_1 ^ 3) = *lf_dptr_1;
              lf_i_1 = lf_i_1 + 1;
              lf_dptr_1 = lf_dptr_1 + 1;
            }
            args_local._4_4_ = GetPosSmallp((unsigned_long)pLVar3);
          }
          break;
        case 0xe0006:
          pLVar3 = NativeAligned4FromLAddr(args[2]);
          *pLVar3 = (LispPTR)sbuf.st_nlink;
          args_local._4_4_ = 0x4c;
          break;
        case 0xe0008:
          LVar2 = car(args[2]);
          LVar2 = cdr(LVar2);
          pLVar3 = NativeAligned4FromLAddr(LVar2);
          *pLVar3 = (LispPTR)sbuf.st_rdev;
          LVar2 = cdr(args[2]);
          LVar2 = car(LVar2);
          LVar2 = cdr(LVar2);
          pLVar3 = NativeAligned4FromLAddr(LVar2);
          *pLVar3 = (int)sbuf.st_atim.tv_nsec + 0x1c94b00;
          LVar2 = cdr(args[2]);
          LVar2 = cdr(LVar2);
          LVar2 = car(LVar2);
          LVar2 = cdr(LVar2);
          pLVar3 = NativeAligned4FromLAddr(LVar2);
          *pLVar3 = (int)sbuf.st_blocks + 0x1c94b00;
          LVar2 = cdr(args[2]);
          LVar2 = cdr(LVar2);
          LVar2 = cdr(LVar2);
          LVar2 = car(LVar2);
          LVar2 = cdr(LVar2);
          pLVar3 = NativeAligned4FromLAddr(LVar2);
          *pLVar3 = (LispPTR)sbuf.st_nlink;
          alarm(TIMEOUT_TIME);
          do {
            piVar6 = __errno_location();
            *piVar6 = 0;
            ppVar7 = getpwuid(sbuf.st_nlink._4_4_);
            bVar8 = false;
            if (ppVar7 == (passwd *)0x0) {
              piVar6 = __errno_location();
              bVar8 = *piVar6 == 4;
            }
          } while (bVar8);
          alarm(0);
          if (ppVar7 == (passwd *)0x0) {
            args_local._4_4_ = 0xe0000;
          }
          else {
            LVar2 = cdr(args[2]);
            LVar2 = cdr(LVar2);
            LVar2 = cdr(LVar2);
            LVar2 = cdr(LVar2);
            LVar2 = car(LVar2);
            LVar2 = cdr(LVar2);
            pLVar3 = NativeAligned4FromLAddr(LVar2);
            lf_i_2 = (size_t)NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
            x = strlen(ppVar7->pw_name);
            lf_dptr_2 = ppVar7->pw_name;
            for (local_3388 = 0; local_3388 < x; local_3388 = local_3388 + 1) {
              *(char *)(lf_i_2 ^ 3) = *lf_dptr_2;
              lf_i_2 = lf_i_2 + 1;
              lf_dptr_2 = lf_dptr_2 + 1;
            }
            args_local._4_4_ = GetPosSmallp(x);
          }
        }
      }
      else {
        piVar6 = __errno_location();
        *Lisp_errno = *piVar6;
        args_local._4_4_ = 0;
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_getfileinfo(LispPTR *args)
{
  int dskp, rval;
  size_t len;
  unsigned *bufp;
#ifndef DOS
  struct passwd *pwd;
#endif
  char *base;
  char lfname[MAXPATHLEN + 5], file[MAXPATHLEN], host[MAXNAMLEN];
  char dir[MAXPATHLEN], name[MAXNAMLEN], ver[VERSIONLEN];
  struct stat sbuf;
  LispPTR laddr;
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add 5 for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
#ifdef DOS
  separate_host(lfname, host, drive);
#else
  separate_host(lfname, host);
#endif

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

/*
 * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
 * convert a version field.
 */
#ifdef DOS
  unixpathname(lfname, file, dskp, 0, drive, &extlen, rawname);
#else  /* DOS */
  unixpathname(lfname, file, dskp, 0);
#endif /* DOS */

  /*
   * The file name which has been passed from Lisp is sometimes different
   * from the actual file name on DSK, even after the Lisp name is converted
   * to UNIX form with unixpathname.  The Lisp code for GETFILEINFO always
   * recognizes a file with old mode.  Thus, we recognize it again using
   * get_old routine.  It will let us know the "real accessible" name of
   * the file.
   */
  if (dskp) {
    if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);
    if (true_name(dir) != -1) return (0);
    if (strcmp(name, "") == 0) {
      /*
       * The directory is specified.
       */
      strcpy(file, dir);
    } else {
      if (get_version_array(dir, name) == 0) return (NIL);
      ConcNameAndVersion(name, ver, file);
      if (get_old(dir, VA.files, file, name) == 0) return (NIL);
    }
  }

  TIMEOUT(rval = stat(file, &sbuf));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  switch (args[1]) {
    case LENGTH:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)sbuf.st_size;
      return (ATOM_T);

    case WDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_mtime);
      return (ATOM_T);

    case RDATE:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = (unsigned)ToLispTime(sbuf.st_atime);
      return (ATOM_T);

    case PROTECTION:
      bufp = (unsigned *)NativeAligned4FromLAddr(args[2]);
      *bufp = sbuf.st_mode;
      return (ATOM_T);

    case AUTHOR: {
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) {
        /*
         * Returns Lisp 0.  Lisp code handles this case as author
         * unknown.  The returned value from Lisp GETFILEINFO
         * function would be "".
         */
        return (SMALLP_ZERO);
      }
      STRING_BASE(args[2], base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    case ALL: {
      /*
       * The format of the buffer which has been allocated by Lisp
       * is as follows.
       * 	((LENGTH	.	fixp)
       *	 (WDATE		.	fixp)
       *	 (RDATE		.	fixp)
       *	 (PROTECTION	.	fixp)
       *	 (AUTHOR	.	string))
       */
      laddr = cdr(car(args[2]));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_size;

      laddr = cdr(car(cdr(args[2])));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_mtime);

      laddr = cdr(car(cdr(cdr(args[2]))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = ToLispTime(sbuf.st_atime);

      laddr = cdr(car(cdr(cdr(cdr(args[2])))));
      bufp = (unsigned *)NativeAligned4FromLAddr(laddr);
      *bufp = sbuf.st_mode;
#ifndef DOS
      TIMEOUT0(pwd = getpwuid(sbuf.st_uid));
      if (pwd == (struct passwd *)NULL) { return (SMALLP_ZERO); }
      laddr = cdr(car(cdr(cdr(cdr(cdr(args[2]))))));
      STRING_BASE(laddr, base);
      len = strlen(pwd->pw_name);
#ifndef BYTESWAP
      strncpy(base, pwd->pw_name, len);
#else
      StrNCpyFromCToLisp(base, pwd->pw_name, len);
#endif /* BYTESWAP	 */
#endif /* DOS */
      return (GetPosSmallp(len));
    }
    default: return (NIL);
  }
}